

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::Node<ReplaceExtraCompilerCacheKey,QString>::emplaceValue<QString_const&>
          (Node<ReplaceExtraCompilerCacheKey,QString> *this,QString *args)

{
  char16_t *pcVar1;
  qsizetype qVar2;
  long in_FS_OFFSET;
  Data *pDVar3;
  QArrayDataPointer<char16_t> local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (args->d).d;
  pcVar1 = (args->d).ptr;
  qVar2 = (args->d).size;
  if (pDVar3 == (Data *)0x0) {
    pDVar3 = (Data *)0x0;
  }
  else {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_28.d = *(Data **)(this + 0x70);
  local_28.ptr = *(char16_t **)(this + 0x78);
  *(Data **)(this + 0x70) = pDVar3;
  *(char16_t **)(this + 0x78) = pcVar1;
  local_28.size = *(qsizetype *)(this + 0x80);
  *(qsizetype *)(this + 0x80) = qVar2;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }